

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O1

PagePoolPage * __thiscall Memory::PagePool::GetPage(PagePool *this,bool useReservedPages)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PagePoolPage *pPVar4;
  char *message;
  char *error;
  PagePoolPage *page;
  PagePoolFreePage *pPVar5;
  uint lineNumber;
  PageSegment *local_20;
  PageSegment *pageSegment;
  
  pPVar5 = this->freePageList;
  if (pPVar5 == (PagePoolFreePage *)0x0) {
    if ((!useReservedPages) || (pPVar5 = this->reservedPageList, pPVar5 == (PagePoolFreePage *)0x0))
    {
      pPVar4 = (PagePoolPage *)
               PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               ::AllocPages(&this->pageAllocator,1,&local_20);
      if (pPVar4 != (PagePoolPage *)0x0) {
        pPVar4->pageAllocator = &this->pageAllocator;
        pPVar4->pageSegment = local_20;
        pPVar4->isReserved = false;
        return pPVar4;
      }
      return (PagePoolPage *)0x0;
    }
    this->reservedPageList = pPVar5->nextFreePage;
    if ((pPVar5->super_PagePoolPage).isReserved != false) {
      return &pPVar5->super_PagePoolPage;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    error = "(page->IsReserved())";
    message = "page->IsReserved()";
    lineNumber = 0x7a;
  }
  else {
    this->freePageList = pPVar5->nextFreePage;
    if ((pPVar5->super_PagePoolPage).isReserved != true) {
      return &pPVar5->super_PagePoolPage;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    error = "(!page->IsReserved())";
    message = "!page->IsReserved()";
    lineNumber = 0x72;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar3 = 0;
    return &pPVar5->super_PagePoolPage;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

PagePoolPage * GetPage(bool useReservedPages = false)
    {
        if (freePageList != nullptr)
        {
            PagePoolPage * page = freePageList;
            freePageList = freePageList->nextFreePage;
            Assert(!page->IsReserved());
            return page;
        }

        if (useReservedPages && reservedPageList != nullptr)
        {
            PagePoolPage * page = reservedPageList;
            reservedPageList = reservedPageList->nextFreePage;
            Assert(page->IsReserved());
            return page;
        }

        return PagePoolPage::New(&pageAllocator);
    }